

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O3

void __thiscall cbtHashedSimplePairCache::removeAllPairs(cbtHashedSimplePairCache *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  cbtSimplePair *ptr;
  undefined8 uVar4;
  cbtSimplePair *pcVar5;
  long lVar6;
  long lVar7;
  
  pcVar5 = (this->m_overlappingPairArray).m_data;
  if ((pcVar5 != (cbtSimplePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(pcVar5);
  }
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (cbtSimplePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  piVar3 = (this->m_hashTable).m_data;
  if ((piVar3 != (int *)0x0) && ((this->m_hashTable).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(piVar3);
  }
  (this->m_hashTable).m_ownsMemory = true;
  (this->m_hashTable).m_data = (int *)0x0;
  (this->m_hashTable).m_size = 0;
  (this->m_hashTable).m_capacity = 0;
  piVar3 = (this->m_next).m_data;
  if ((piVar3 != (int *)0x0) && ((this->m_next).m_ownsMemory == true)) {
    cbtAlignedFreeInternal(piVar3);
  }
  (this->m_next).m_ownsMemory = true;
  (this->m_next).m_data = (int *)0x0;
  (this->m_next).m_size = 0;
  (this->m_next).m_capacity = 0;
  if ((this->m_overlappingPairArray).m_capacity < 2) {
    pcVar5 = (cbtSimplePair *)cbtAlignedAllocInternal(0x20,0x10);
    lVar6 = (long)(this->m_overlappingPairArray).m_size;
    if (0 < lVar6) {
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&((this->m_overlappingPairArray).m_data)->m_indexA + lVar7);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pcVar5->m_indexA + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 * 0x10 != lVar7);
    }
    ptr = (this->m_overlappingPairArray).m_data;
    if ((ptr != (cbtSimplePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_overlappingPairArray).m_ownsMemory = true;
    (this->m_overlappingPairArray).m_data = pcVar5;
    (this->m_overlappingPairArray).m_capacity = 2;
  }
  growTables(this);
  return;
}

Assistant:

void cbtHashedSimplePairCache::removeAllPairs()
{
	m_overlappingPairArray.clear();
	m_hashTable.clear();
	m_next.clear();

	int initialAllocatedSize = 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}